

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
* testing::internal::edit_distance::CalculateOptimalEdits
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *left,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *right)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  string *in_RDI;
  size_t i_1;
  size_t i;
  InternalStrings intern_table;
  vector<unsigned_long,_std::allocator<unsigned_long>_> right_ids;
  vector<unsigned_long,_std::allocator<unsigned_long>_> left_ids;
  value_type_conflict3 *in_stack_ffffffffffffff28;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff30;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  InternalStrings *in_stack_ffffffffffffff58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_80;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x18c819);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x18c826);
  anon_unknown_1::InternalStrings::InternalStrings((InternalStrings *)0x18c830);
  local_80 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  while( true ) {
    this = local_80;
    pvVar1 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(in_RSI);
    if (pvVar1 <= this) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](in_RSI,(size_type)local_80);
    anon_unknown_1::InternalStrings::GetId(in_stack_ffffffffffffff58,in_RDI);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    local_80 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&(local_80->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                       ._M_impl.super__Vector_impl_data._M_start + 1);
  }
  local_a0 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  while( true ) {
    pvVar1 = local_a0;
    pvVar2 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(in_RDX);
    if (pvVar2 <= pvVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](in_RDX,(size_type)local_a0);
    in_stack_ffffffffffffff58 =
         (InternalStrings *)anon_unknown_1::InternalStrings::GetId(in_stack_ffffffffffffff58,in_RDI)
    ;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (pvVar1,(value_type_conflict3 *)in_stack_ffffffffffffff58);
    local_a0 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&(local_a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                       ._M_impl.super__Vector_impl_data._M_start + 1);
  }
  anon_unknown_1::InternalStrings::~InternalStrings((InternalStrings *)0x18c95b);
  CalculateOptimalEdits
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)left,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)right);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(this);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(this);
  return (vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
          *)in_RDI;
}

Assistant:

std::vector<EditType> CalculateOptimalEdits(
    const std::vector<std::string>& left,
    const std::vector<std::string>& right) {
  std::vector<size_t> left_ids, right_ids;
  {
    InternalStrings intern_table;
    for (size_t i = 0; i < left.size(); ++i) {
      left_ids.push_back(intern_table.GetId(left[i]));
    }
    for (size_t i = 0; i < right.size(); ++i) {
      right_ids.push_back(intern_table.GetId(right[i]));
    }
  }
  return CalculateOptimalEdits(left_ids, right_ids);
}